

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O1

bool jessilib::equalsi<char16_t,char16_t>
               (basic_string_view<char16_t,_std::char_traits<char16_t>_> lhs,
               basic_string_view<char16_t,_std::char_traits<char16_t>_> rhs)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char16_t *pcVar4;
  long lVar5;
  long lVar6;
  char16_t *pcVar7;
  wchar32 wVar8;
  wchar32 wVar9;
  size_t sVar10;
  size_t sVar11;
  
  pcVar4 = rhs._M_str;
  sVar11 = rhs._M_len;
  pcVar7 = lhs._M_str;
  sVar10 = lhs._M_len;
  if (sVar10 != sVar11) {
    return false;
  }
  do {
    if ((sVar10 == 0) || (sVar11 == 0)) {
      return sVar10 == 0 && sVar11 == 0;
    }
    wVar8 = (wchar32)(ushort)*pcVar7;
    lVar5 = 1;
    if (((sVar10 == 1) || ((wVar8 & 0xfc00U) != 0xd800)) || (((ushort)pcVar7[1] & 0xfc00) != 0xdc00)
       ) {
      lVar6 = 1;
    }
    else {
      wVar8 = (uint)(ushort)*pcVar7 * 0x400 + (uint)(ushort)pcVar7[1] + L'\xfca02400';
      lVar6 = 2;
    }
    wVar9 = (wchar32)(ushort)*pcVar4;
    if (((sVar11 != 1) && ((wVar9 & 0xfc00U) == 0xd800)) && (((ushort)pcVar4[1] & 0xfc00) == 0xdc00)
       ) {
      wVar9 = (uint)(ushort)*pcVar4 * 0x400 + (uint)(ushort)pcVar4[1] + L'\xfca02400';
      lVar5 = 2;
    }
    if (wVar8 == wVar9) {
LAB_00235f82:
      pcVar7 = pcVar7 + lVar6;
      sVar10 = sVar10 - lVar6;
      pcVar4 = pcVar4 + lVar5;
      sVar11 = sVar11 - lVar5;
      bVar1 = true;
    }
    else {
      iVar2 = jessilib::fold(wVar8);
      iVar3 = jessilib::fold(wVar9);
      if (iVar2 == iVar3) goto LAB_00235f82;
      bVar1 = false;
    }
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool equalsi(std::basic_string_view<LhsCharT> lhs, std::basic_string_view<RhsCharT> rhs) {
	// If lhs and rhs are the same type, compare their sizes and quickly return if not same
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (lhs.size() != rhs.size()) {
			return false;
		}
	}

	while (!lhs.empty() && !rhs.empty()) {
		auto lhs_front = decode_codepoint(lhs);
		auto rhs_front = decode_codepoint(rhs);

		if (lhs_front.units == 0
			|| rhs_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return false;
		}

		if (!equalsi(lhs_front.codepoint, rhs_front.codepoint)) {
			// Codepoints don't fold to same value
			return false;
		}

		// Codepoints are equal; trim off the fronts and continue
		lhs.remove_prefix(lhs_front.units);
		rhs.remove_prefix(rhs_front.units);
	}

	return lhs.empty() && rhs.empty();
}